

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O3

RGB __thiscall
RayTracer::processPixelOnSphere
          (RayTracer *this,Point *rayBeg,Point *pointOnSphere,const_iterator sphereIt,
          int recursionLevel)

{
  Point *light;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  pointer pSVar7;
  pointer pPVar8;
  bool bVar9;
  RGB RVar10;
  uint uVar11;
  Sphere *pSVar12;
  pointer object;
  float fVar13;
  undefined1 local_78 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  for (pSVar12 = (this->super_RayTracerBase).config.spheres.
                 super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
                 ._M_start; pSVar12 != sphereIt._M_current; pSVar12 = pSVar12 + 1) {
    bVar9 = pointInShadow<Sphere>(pointOnSphere,light,pSVar12);
    if (bVar9) goto LAB_00105151;
  }
  pSVar7 = (this->super_RayTracerBase).config.spheres.
           super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pSVar12 = sphereIt._M_current + 1; pSVar12 != pSVar7; pSVar12 = pSVar12 + 1) {
    bVar9 = pointInShadow<Sphere>(pointOnSphere,light,pSVar12);
    if (bVar9) goto LAB_00105151;
  }
  pPVar8 = (this->super_RayTracerBase).config.planes.
           super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (object = (this->super_RayTracerBase).config.planes.
                super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                _M_start; object != pPVar8; object = object + 1) {
    bVar9 = pointInShadow<Plane>(pointOnSphere,light,object);
    if (bVar9) goto LAB_00105151;
  }
  uVar2 = pointOnSphere->x;
  uVar4 = pointOnSphere->y;
  fVar1 = (sphereIt._M_current)->radius;
  refl.a.x = (pointOnSphere->z - ((sphereIt._M_current)->center).z) / fVar1;
  local_78._4_4_ = ((float)uVar4 - ((sphereIt._M_current)->center).y) / fVar1;
  local_78._0_4_ = ((float)uVar2 - ((sphereIt._M_current)->center).x) / fVar1;
  uVar3 = (this->super_RayTracerBase).config.super_BaseConfig.light.x;
  uVar5 = (this->super_RayTracerBase).config.super_BaseConfig.light.y;
  refl.b.y = (float)uVar3 - (float)uVar2;
  refl.b.z = (float)uVar5 - (float)uVar4;
  RVar10 = calculateColorInLight
                     (this,(sphereIt._M_current)->color,(Vector *)local_78,(Vector *)&refl.b.y);
  uVar11 = (uint)(uint3)RVar10;
LAB_00105236:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((sphereIt._M_current)->reflectionCoefficient))) {
    refl.b.y = rayBeg->x;
    refl.b.z = rayBeg->y;
    reflection((Segment *)&refl.b.y,sphereIt._M_current);
    RVar10 = processPixel(this,(Segment *)local_78,recursionLevel + 1);
    fVar1 = (sphereIt._M_current)->reflectionCoefficient;
    fVar13 = 1.0 - fVar1;
    uVar11 = (uint)(byte)((char)(int)((float)((uint3)RVar10 & 0xff) * fVar1) +
                         (char)(int)((float)(uVar11 & 0xff) * fVar13)) |
             (uint)(byte)((char)(int)((float)(RVar10._1_2_ & 0xff) * fVar1) +
                         (char)(int)((float)(uVar11 >> 8 & 0xff) * fVar13)) << 8 |
             (uint)(byte)((char)(int)((float)RVar10.b * fVar1) +
                         (char)(int)((float)(uVar11 >> 0x10 & 0xff) * fVar13)) << 0x10;
  }
  return SUB43(uVar11,0);
LAB_00105151:
  uVar6._0_1_ = ((sphereIt._M_current)->color).r;
  uVar6._1_1_ = ((sphereIt._M_current)->color).g;
  fVar1 = (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient;
  uVar11 = (int)((float)(uVar6 & 0xff) * fVar1) & 0xffU |
           ((int)((float)(uVar6 >> 8) * fVar1) & 0xffU) << 8 |
           (int)((float)((sphereIt._M_current)->color).b * fVar1) << 0x10;
  goto LAB_00105236;
}

Assistant:

RGB RayTracer::processPixelOnSphere(Point const& rayBeg, Point const& pointOnSphere,
                                    std::vector<Sphere>::const_iterator sphereIt,
                                    int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnSphere, config.light, config.spheres.cbegin(), sphereIt)
      || pointInShadow(pointOnSphere, config.light, sphereIt + 1, config.spheres.cend())
      || pointInShadow(pointOnSphere, config.light, config.planes.cbegin(), config.planes.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = sphereIt->color * config.ambientCoefficient;
  else
  {
    Vector const normalVec = (pointOnSphere - sphereIt->center) / sphereIt->radius;
    resultCol = calculateColorInLight(sphereIt->color, normalVec, config.light - pointOnSphere);
  }

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(sphereIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnSphere}, *sphereIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, sphereIt->reflectionCoefficient);
}